

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void usage(void)

{
  fprintf(_stderr,
          "Usage: nagel input-path output-path seq-name. [-SG n.n] [-TG n.n] [-M n] [-I n] [-A n.n] [-D n.n] [-B cols rows] [-F n.n] [-C corr-vel-file nbins increment]\n"
         );
  fprintf(_stderr,"[-SG n.n]        : sigma value for spatial gaussian\n");
  fprintf(_stderr,"                   default value is 3.0\n");
  fprintf(_stderr,"[-TG n.n]        : sigma value for temporal gaussian\n");
  fprintf(_stderr,"                   default value is 1.5\n");
  fprintf(_stderr,"[-M n]           : middle frame of image sequence\n");
  fprintf(_stderr,"                   default value is 0\n");
  fprintf(_stderr,"[-I n]           : number of relaxation iterations\n");
  fprintf(_stderr,"                   default value is 10\n");
  fprintf(_stderr,"[-A n.n]         : smoothing parameter alpha\n");
  fprintf(_stderr,"                   default value is 5.0\n");
  fprintf(_stderr,"[-D n.n]         : delta parameter\n");
  fprintf(_stderr,"                   default value is 1.0\n");
  fprintf(_stderr,"[-B cols rows]   : for binary input files without header\n");
  fprintf(_stderr,"[-F n.n]         : filters out unreliable estimates\n");
  fprintf(_stderr,"                   using the magnitude of local gradient\n");
  fprintf(_stderr,"[-C corr-vel-file nbins increment]\n");
  fprintf(_stderr,"                 : error histogram\n");
  fprintf(_stderr,"                   corr-vel-file : file of correct velocities\n");
  fprintf(_stderr,"                   nbins : number of bins for histogram\n");
  fprintf(_stderr,"                   increment : value of gap between bins\n");
  exit(1);
}

Assistant:

void usage()

{
  fprintf(stderr,"Usage: nagel input-path output-path seq-name. [-SG n.n] [-TG n.n] [-M n] [-I n] [-A n.n] [-D n.n] [-B cols rows] [-F n.n] [-C corr-vel-file nbins increment]\n") ;
  fprintf(stderr,"[-SG n.n]        : sigma value for spatial gaussian\n") ;
  fprintf(stderr,"                   default value is 3.0\n") ;
  fprintf(stderr,"[-TG n.n]        : sigma value for temporal gaussian\n") ;
  fprintf(stderr,"                   default value is 1.5\n") ;
  fprintf(stderr,"[-M n]           : middle frame of image sequence\n") ;
  fprintf(stderr,"                   default value is 0\n") ;
  fprintf(stderr,"[-I n]           : number of relaxation iterations\n") ;
  fprintf(stderr,"                   default value is 10\n") ;
  fprintf(stderr,"[-A n.n]         : smoothing parameter alpha\n") ;
  fprintf(stderr,"                   default value is 5.0\n") ;
  fprintf(stderr,"[-D n.n]         : delta parameter\n") ;
  fprintf(stderr,"                   default value is 1.0\n") ;
  fprintf(stderr,"[-B cols rows]   : for binary input files without header\n") ;
  fprintf(stderr,"[-F n.n]         : filters out unreliable estimates\n") ;
  fprintf(stderr,"                   using the magnitude of local gradient\n") ;
  fprintf(stderr,"[-C corr-vel-file nbins increment]\n") ;
  fprintf(stderr,"                 : error histogram\n") ;
  fprintf(stderr,"                   corr-vel-file : file of correct velocities\n") ;
  fprintf(stderr,"                   nbins : number of bins for histogram\n") ;
  fprintf(stderr,"                   increment : value of gap between bins\n") ;
  exit(EXIT_FAILURE) ;
}